

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O3

char * nni_strcasestr(char *s1,char *s2)

{
  char cVar1;
  long lVar2;
  __int32_t **pp_Var3;
  long lVar4;
  char cVar5;
  
  cVar5 = *s1;
  do {
    if (cVar5 == '\0') {
      return (char *)0x0;
    }
    lVar2 = 1;
    do {
      lVar4 = lVar2;
      cVar1 = s2[lVar4 + -1];
      if ((long)cVar1 == 0) {
        return s1;
      }
      pp_Var3 = __ctype_tolower_loc();
      if ((*pp_Var3)[cVar5] != (*pp_Var3)[cVar1]) goto LAB_0011cec9;
      cVar5 = s1[lVar4];
      lVar2 = lVar4 + 1;
    } while (cVar5 != '\0');
    if (s2[lVar4] == '\0') {
      return s1;
    }
LAB_0011cec9:
    cVar5 = s1[1];
    s1 = s1 + 1;
  } while( true );
}

Assistant:

char *
nni_strcasestr(const char *s1, const char *s2)
{
#ifdef NNG_HAVE_STRCASESTR
	return (strcasestr(s1, s2));
#else
	const char *t1, *t2;
	while (*s1) {
		for (t1 = s1, t2 = s2; *t1 && *t2; t2++, t1++) {
			if (tolower(*t1) != tolower(*t2)) {
				break;
			}
		}
		if (*t2 == 0) {
			return ((char *) s1);
		}
		s1++;
	}
	return (NULL);
#endif
}